

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizerHybrid::ChOptimizerHybrid(ChOptimizerHybrid *this)

{
  ChOptimizerGenetic *this_00;
  ChOptimizerLocal *this_01;
  
  (this->super_ChOptimizer).err_message[0] = '\0';
  (this->super_ChOptimizer).error_code = 0;
  (this->super_ChOptimizer).C_vars = 0;
  (this->super_ChOptimizer).afunction = (ChFx *)0x0;
  (this->super_ChOptimizer).afunctionGrad = (ChFx *)0x0;
  (this->super_ChOptimizer).xv = (double *)0x0;
  (this->super_ChOptimizer).xv_sup = (double *)0x0;
  *(undefined8 *)((long)&(this->super_ChOptimizer).xv_sup + 1) = 0;
  *(undefined8 *)((long)&(this->super_ChOptimizer).xv_inf + 1) = 0;
  (this->super_ChOptimizer).fx_evaluations = 0;
  (this->super_ChOptimizer).grad_evaluations = 0;
  (this->super_ChOptimizer).grad_step = 1e-12;
  (this->super_ChOptimizer).opt_fx = 0.0;
  (this->super_ChOptimizer).break_funct = (_func_int *)0x0;
  (this->super_ChOptimizer).break_cycles = 10;
  (this->super_ChOptimizer).user_break = 0;
  (this->super_ChOptimizer).break_cyclecounter = 0;
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizerHybrid_00b3aaf0;
  this_00 = (ChOptimizerGenetic *)::operator_new(0x210);
  ChOptimizerGenetic::ChOptimizerGenetic(this_00);
  this->genetic_opt = this_00;
  this_01 = (ChOptimizerLocal *)::operator_new(0x188);
  ChOptimizerLocal::ChOptimizerLocal(this_01);
  this->local_opt = this_01;
  this->current_phase = 0;
  this->use_genetic = true;
  this->use_local = true;
  return;
}

Assistant:

ChOptimizerHybrid::ChOptimizerHybrid()
    : ChOptimizer()  // note: implicit
{
    genetic_opt = new ChOptimizerGenetic();
    local_opt = new ChOptimizerLocal();

    current_phase = 0;
    use_genetic = true;
    use_local = true;
}